

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DepsBuildEngineTest.cpp
# Opt level: O0

void __thiscall
(anonymous_namespace)::DepsBuildEngineTest_BogusConcurrentDepScan_Test::TestBody()::DynamicTask::
inputsAvailable(llbuild::core::TaskInterface_(void *this,TaskInterface ti)

{
  ValueType local_38;
  void *local_20;
  DynamicTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DynamicTask *)ti.impl;
  local_20 = this;
  anon_unknown.dwarf_67cc9::intToValue(&local_38,*(int32_t *)((long)this + 8));
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,false);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
      ti.complete(intToValue(result));
    }